

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitroot.c
# Opt level: O2

void ur_df(double *y,int N,char *alternative,int *klag,double *statistic,double *pval)

{
  size_t __size;
  double dVar1;
  uint uVar2;
  int iVar3;
  double *oup;
  void *__src;
  double *res;
  double *y_00;
  void *__src_00;
  double *xin;
  long lVar4;
  double *x;
  reg_object obj;
  long lVar5;
  ulong uVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  double *yin;
  long lVar10;
  double local_2b8;
  double dftable [48];
  double prob [8];
  double *local_48;
  
  prob[7] = 25.0;
  prob[5] = 0.975;
  prob[6] = 0.99;
  prob[3] = 0.9;
  prob[4] = 0.95;
  prob[1] = 0.05;
  prob[2] = 0.1;
  dftable[0x2f] = 0.01;
  prob[0] = 0.025;
  yin = &local_2b8;
  memcpy(yin,&DAT_00151160,0x180);
  if (klag == (int *)0x0) {
    dVar1 = pow((double)N + -1.0,0.3333333333333333);
    uVar2 = (uint)dVar1;
  }
  else {
    uVar2 = *klag;
  }
  lVar10 = (long)(int)((N + -1) - (uVar2 + 1));
  lVar8 = lVar10 + 1;
  oup = (double *)malloc((long)N * 8 - 8);
  __size = lVar10 * 8 + 8;
  lVar5 = (long)(int)(uVar2 + 1);
  __src = malloc(__size * lVar5);
  res = (double *)malloc(__size);
  y_00 = (double *)malloc(__size);
  __src_00 = malloc(__size);
  xin = (double *)malloc(0x40);
  diff(y,N,1,oup);
  uVar6 = (ulong)uVar2;
  pvVar7 = __src;
  for (lVar4 = 0; lVar4 <= (int)uVar2; lVar4 = lVar4 + 1) {
    for (lVar9 = 0; lVar9 <= lVar10; lVar9 = lVar9 + 1) {
      *(double *)((long)pvVar7 + lVar9 * 8) = oup[(int)uVar6 + (int)lVar9];
    }
    pvVar7 = (void *)((long)pvVar7 + __size);
    uVar6 = uVar6 - 1;
  }
  memcpy(y_00,__src,__size);
  for (lVar4 = 0; lVar4 <= lVar10; lVar4 = lVar4 + 1) {
    *(double *)((long)__src_00 + lVar4 * 8) = (double)(int)(uVar2 + 1 + (int)lVar4);
  }
  iVar3 = (int)lVar8;
  if ((int)uVar2 < 1) {
    x = (double *)malloc(lVar8 * 0x18);
    local_48 = (double *)malloc(0x48);
    obj = reg_init(iVar3,3);
    memcpy(x,y + lVar5 + -1,__size);
    memcpy(x + lVar8,__src_00,__size);
  }
  else {
    uVar6 = (ulong)(uVar2 + 3);
    x = (double *)malloc(__size * uVar6);
    local_48 = (double *)malloc(uVar6 * uVar6 * 8);
    obj = reg_init(iVar3,uVar2 + 3);
    memcpy(x,y + lVar5 + -1,__size);
    memcpy(x + lVar8,__src_00,__size);
    memcpy(x + iVar3 * 2,(void *)((long)__src + lVar8 * 8),uVar2 * __size);
  }
  regress(obj,x,y_00,res,local_48,0.95);
  *statistic = *(double *)(obj + 1) / obj[1].sigma_lower;
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
    dVar1 = interpolate_linear(prob + 7,yin,6,(double)(N + -1));
    xin[lVar8] = dVar1;
    yin = yin + 6;
  }
  dVar1 = interpolate_linear(xin,dftable + 0x2f,8,*statistic);
  iVar3 = strcmp(alternative,"stationary");
  if (iVar3 != 0) {
    iVar3 = strcmp(alternative,"explosive");
    if (iVar3 != 0) {
      puts("alternative accepts only two values - stationary and explosive ");
      exit(-1);
    }
    dVar1 = 1.0 - dVar1;
  }
  *pval = dVar1;
  if (klag != (int *)0x0) {
    *klag = uVar2;
  }
  free(oup);
  free(__src);
  free(res);
  free(y_00);
  free(__src_00);
  free(x);
  free(local_48);
  free(xin);
  free_reg(obj);
  return;
}

Assistant:

void ur_df(double *y, int N,const char* alternative, int *klag, double *statistic,double *pval) {
    /*
    y - Time Series data of length N
    alternative - "stationary" or "explosive"

    klag - Length of the lag. Uses pow((double)N - 1.0, 1.0/3.0) if klag == NULL
    Outputs

    statistic - Test statistic
    pval - p-value used to determine null hypothesis

    */
    int lag,lags,N1,i,j,N2,p,k,pN,tN,Nout,iter;
    double *x,*z,*res,*XX,*Y,*tt,*varcovar,*tablep;
    reg_object fit;
    double alpha,ssr,interp;
    double nT[6] = {25, 50, 100, 250, 500, 100000};
    double prob[8] ={0.01, 0.025, 0.05, 0.10, 0.90, 0.95, 0.975, 0.99};
    double dftable[48] = {-4.38, -4.15, -4.04, -3.99, -3.98, -3.96,-3.95, -3.80, -3.73, -3.69, -3.68, -3.66,-3.60, -3.50, -3.45,
     -3.43, -3.42, -3.41,-3.24, -3.18, -3.15, -3.13, -3.13, -3.12,-1.14, -1.19, -1.22, -1.23, -1.24, -1.25,-0.80, -0.87, -0.90, -0.92,
      -0.93, -0.94,-0.50, -0.58, -0.62, -0.64, -0.65, -0.66,-0.15, -0.24, -0.28, -0.31, -0.32, -0.33};// 8X6

    pN = 8;
    tN = 6;
    Nout = 50;

    lags = (klag == NULL) ? (int) pow((double)N - 1.0, 1.0/3.0) : *klag;

    alpha = 0.95;
    lag = lags;
    lags++;
    N1 = N - 1;
    N2 = N1 - lags + 1;

    z = (double*)malloc(sizeof(double)*N1);
    x = (double*)malloc(sizeof(double)*(N1-lags+1)*lags);
    res = (double*)malloc(sizeof(double)*N2);
    Y = (double*)malloc(sizeof(double)*N2);
    tt = (double*)malloc(sizeof(double)*N2);
    tablep = (double*)malloc(sizeof(double)*pN);

    diff(y,N,1,z);// z = y(t) - y(t-1)

    //mdisplay(z,1,N1);
    
    for(i = 0; i < lags;++i) {
        for(j = 0;j < N2;++j) {
            x[i*N2+j] = z[lags+j-i-1];
        }
    } 

    //mdisplay(x,lags,N1-lags+1);
    
    memcpy(Y,x,sizeof(double)*N2);

    for(i = 0; i < N2;++i) {
        tt[i] = (double) (i + lags);
    }
    

    if (lags > 1) {
        //lags 5
        p = lags + 2;
        XX = (double*)malloc(sizeof(double)*N2*p);
        varcovar = (double*)malloc(sizeof(double)*p*p);
        fit = reg_init(N2,p);
        memcpy(XX,y+lags-1,sizeof(double)*N2);
        memcpy(XX+N2,tt,sizeof(double)*N2);
        memcpy(XX+2*N2,x+N2,sizeof(double)*N2*(lags-1));
        regress(fit,XX,Y,res,varcovar,alpha);
    } else {
        p = 3;
        XX = (double*)malloc(sizeof(double)*N2*p);
        varcovar = (double*)malloc(sizeof(double)*p*p);
        fit = reg_init(N2,p);
        memcpy(XX,y+lags-1,sizeof(double)*N2);
        memcpy(XX+N2,tt,sizeof(double)*N2);
        regress(fit,XX,Y,res,varcovar,alpha);
    }

    *statistic = (fit->beta+1)->value / (fit->beta+1)->stdErr;

    for(i = 0; i < pN;++i) {
        iter = i * tN;
        tablep[i] = interpolate_linear(nT,dftable+iter,tN,(double)N1);
    }

    interp = interpolate_linear(tablep,prob,pN,*statistic);

    //printf("interp %g \n",interp);

    if (!strcmp(alternative,"stationary")) {
        *pval = interp;
    } else if (!strcmp(alternative,"explosive")) {
        *pval = 1.0 - interp;
    } else {
        printf("alternative accepts only two values - stationary and explosive \n");
        exit(-1);
    }

    if (klag != NULL) *klag = lags - 1;
    

    free(z);
    free(x);
    free(res);
    free(Y);
    free(tt);
    free(XX);
    free(varcovar);
    free(tablep);
    free_reg(fit);
}